

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary.cpp
# Opt level: O2

QFunctionPointer __thiscall QLibrary::resolve(QLibrary *this,char *symbol)

{
  bool bVar1;
  QFunctionPointer p_Var2;
  quintptr qVar3;
  
  qVar3 = (this->d).d;
  if (((uint)qVar3 & 7) != 1) {
    bVar1 = load(this);
    if (!bVar1) {
      return (QFunctionPointer)0x0;
    }
    qVar3 = (this->d).d;
  }
  p_Var2 = QLibraryPrivate::resolve((QLibraryPrivate *)(qVar3 & 0xfffffffffffffff8),symbol);
  return p_Var2;
}

Assistant:

QFunctionPointer QLibrary::resolve(const char *symbol)
{
    if (!isLoaded() && !load())
        return nullptr;
    return d->resolve(symbol);
}